

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

void assert_version_id(char **qq,size_t *ss)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  void *in_R8;
  
  pcVar2 = *qq;
  uVar3 = *ss;
  if (uVar3 != 0) {
    pcVar1 = pcVar2 + uVar3;
    do {
      if (*pcVar2 != '.' && 9 < (byte)(*pcVar2 - 0x30U)) goto LAB_00103b3f;
      pcVar2 = pcVar2 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    uVar3 = 0;
    pcVar2 = pcVar1;
  }
LAB_00103b3f:
  if (((*pcVar2 == 'd') && (pcVar2[1] == 'e')) && (pcVar2[2] == 'v')) {
    pcVar2 = pcVar2 + 3;
    uVar3 = uVar3 - 3;
  }
  pcVar2 = pcVar2 + ((byte)(*pcVar2 + 0x9fU) < 4);
  failure("No space after version: ``%s\'\'",pcVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ॕ',(uint)(1 < uVar3),"s > 1",in_R8);
  failure("No space after version: ``%s\'\'",pcVar2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ॗ',(uint)(*pcVar2 == ' '),"*q == \' \'",in_R8);
  *qq = pcVar2 + 1;
  *ss = uVar3 - 1;
  return;
}

Assistant:

static void assert_version_id(char **qq, size_t *ss)
{
	char *q = *qq;
	size_t s = *ss;

	/* Version number is a series of digits and periods. */
	while (s > 0 && (*q == '.' || (*q >= '0' && *q <= '9'))) {
		++q;
		--s;
	}

	if (q[0] == 'd' && q[1] == 'e' && q[2] == 'v') {
		q += 3;
		s -= 3;
	}

	/* Skip a single trailing a,b,c, or d. */
	if (*q == 'a' || *q == 'b' || *q == 'c' || *q == 'd')
		++q;

	/* Version number terminated by space. */
	failure("No space after version: ``%s''", q);
	assert(s > 1);
	failure("No space after version: ``%s''", q);
	assert(*q == ' ');

	++q; --s;

	*qq = q;
	*ss = s;
}